

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_FromContainerConstructor_Test::TestBody(GslSpan_FromContainerConstructor_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  char *pcVar2;
  span<int,__1L> sVar3;
  span<const_int,__1L> sVar4;
  AssertHelper local_260;
  Message local_258;
  int *local_250;
  pointer local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_7;
  Message local_228;
  size_type local_220;
  index_type local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  span<const_int,__1L> cs_1;
  Message local_1e8;
  int *local_1e0;
  pointer local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8;
  size_type local_1b0;
  index_type local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  span<int,__1L> s_1;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_168;
  anon_class_1_0_00000001 local_152;
  anon_class_1_0_00000001 local_151;
  anon_class_1_0_00000001 use_span;
  anon_class_1_0_00000001 get_temp_vector;
  Message local_148;
  int *local_140;
  pointer local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  size_type local_110;
  index_type local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  span<const_int,__1L> cs;
  Message local_d8;
  int *local_d0;
  pointer local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  size_type local_a0;
  index_type local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  span<int,__1L> s;
  vector<int,_std::allocator<int>_> cv;
  allocator<int> local_45;
  int local_44 [3];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  GslSpan_FromContainerConstructor_Test *this_local;
  
  local_44[0] = 1;
  local_44[1] = 2;
  local_44[2] = 3;
  local_38 = local_44;
  local_30 = 3;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::allocator<int>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_45);
  std::allocator<int>::~allocator(&local_45);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&s.storage_.data_,
             (vector<int,_std::allocator<int>_> *)local_28);
  pstore::gsl::span<int,_-1L>::span<int>
            ((span<int,__1L> *)&gtest_ar.message_,(vector<int,_std::allocator<int>_> *)local_28);
  local_98 = pstore::gsl::span<int,_-1L>::size((span<int,__1L> *)&gtest_ar.message_);
  local_a0 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_28);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_90,"s.size ()","static_cast<std::ptrdiff_t> (v.size ())",&local_98,
             (long *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x266,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar.message_);
  local_d0 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)local_28);
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_c0,"s.data ()","v.data ()",&local_c8,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x267,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs.storage_.data_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs.storage_.data_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  pstore::gsl::span<const_int,_-1L>::span<int>
            ((span<const_int,__1L> *)&gtest_ar_2.message_,
             (vector<int,_std::allocator<int>_> *)local_28);
  local_108 = pstore::gsl::span<const_int,_-1L>::size((span<const_int,__1L> *)&gtest_ar_2.message_);
  local_110 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_28);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_100,"cs.size ()","static_cast<std::ptrdiff_t> (v.size ())",&local_108
             ,(long *)&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x26a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_138 = pstore::gsl::span<const_int,_-1L>::data((span<const_int,__1L> *)&gtest_ar_2.message_);
  local_140 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)local_28);
  testing::internal::EqHelper::Compare<const_int_*,_int_*,_nullptr>
            ((EqHelper *)local_130,"cs.data ()","v.data ()",&local_138,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffeb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x26b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffeb0,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  TestBody::anon_class_1_0_00000001::operator()
            ((vector<int,_std::allocator<int>_> *)&s_1.storage_.data_,&local_151);
  pstore::gsl::span<const_int,_-1L>::span<int>
            ((span<const_int,__1L> *)&local_168,
             (vector<int,_std::allocator<int>_> *)&s_1.storage_.data_);
  TestBody::anon_class_1_0_00000001::operator()(&local_152,(span<const_int,__1L>)local_168);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&s_1.storage_.data_);
  sVar3 = pstore::gsl::make_span<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  s_1.storage_.super_extent_type<_1L>.size_ = (index_type)sVar3.storage_.data_;
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )sVar3.storage_.super_extent_type<_1L>.size_;
  local_1a8 = pstore::gsl::span<int,_-1L>::size((span<int,__1L> *)&gtest_ar_4.message_);
  local_1b0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_28);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_1a0,"s.size ()","static_cast<std::ptrdiff_t> (v.size ())",&local_1a8,
             (long *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1d8 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_4.message_);
  local_1e0 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)local_28);
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_1d0,"s.data ()","v.data ()",&local_1d8,&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs_1.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs_1.storage_.data_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs_1.storage_.data_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  sVar4 = pstore::gsl::make_span<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)&s.storage_.data_);
  cs_1.storage_.super_extent_type<_1L>.size_ = (index_type)sVar4.storage_.data_;
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )sVar4.storage_.super_extent_type<_1L>.size_;
  local_218 = pstore::gsl::span<const_int,_-1L>::size((span<const_int,__1L> *)&gtest_ar_6.message_);
  local_220 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&s.storage_.data_);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_210,"cs.size ()","static_cast<std::ptrdiff_t> (cv.size ())",
             &local_218,(long *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_248 = pstore::gsl::span<const_int,_-1L>::data((span<const_int,__1L> *)&gtest_ar_6.message_);
  local_250 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)&s.storage_.data_);
  testing::internal::EqHelper::Compare<const_int_*,_const_int_*,_nullptr>
            ((EqHelper *)local_240,"cs.data ()","cv.data ()",&local_248,&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&s.storage_.data_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST (GslSpan, FromContainerConstructor) {
    std::vector<int> v = {1, 2, 3};
    std::vector<int> const cv = v;

    {
        span<int> s{v};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        span<const int> cs{v};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (cs.data (), v.data ());
    }

#if 0
    std::string str = "hello";
    std::string const cstr = "hello";

    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{str};
        EXPECT_EQ (s.size() == narrow_cast<std::ptrdiff_t>(str.size()) && s.data(), str.data());
#    endif
        span<char const > cs{str};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(str.size()));
        EXPECT_EQ (cs.data(), str.data());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{cstr};
#    endif
        span<const char> cs{cstr};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(cstr.size()));
        EXPECT_EQ (cs.data(), cstr.data());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int> s) { static_cast<void> (s); };
        use_span (get_temp_vector ());
#endif
    }
    {
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int const> s) { static_cast<void> (s); };
        use_span (span<int const> (get_temp_vector ()));
    }
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_string = [] () -> std::string { return {}; };
        auto use_span = [] (span<char> s) { static_cast<void> (s); };
        use_span (get_temp_string ());
#endif
    }
#if 0
    {
        auto get_temp_string = []() -> std::string { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = []() -> const std::vector<int> { return {}; };
        auto use_span = [](span<const char> s) { static_cast<void>(s); };
        use_span(get_temp_vector());
#    endif
    }
    {
        auto get_temp_string = []() -> std::string const { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        std::map<int, int> m;
        span<int> s{m};
#endif
    }
    {
        auto s = make_span (v);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        auto cs = make_span (cv);
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (cv.size ()));
        EXPECT_EQ (cs.data (), cv.data ());
    }
}